

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1fb58b0::WriteGenexEvaluatorArgument
          (anon_unknown_dwarf_1fb58b0 *this,ostream *os,string_view *keyword,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *genexes,string *config,cmLocalGenerator *lg,cmScriptGeneratorIndent indent)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  long *plVar4;
  WrapQuotes wrapQuotes;
  cmScriptGeneratorIndent cVar5;
  string_view str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  byte local_d0;
  string local_c8;
  ostream *local_a8;
  long *local_a0;
  string local_98;
  cmLocalGenerator *local_78;
  string result;
  string local_50;
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_a8 = os;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,genexes,
             (long)&(config->_M_dataplus)._M_p +
             (long)&(genexes->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl);
  plVar4 = (long *)keyword->_M_len;
  local_a0 = (long *)keyword->_M_str;
  local_78 = lg;
  if (plVar4 != local_a0) {
    bVar1 = true;
    do {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar4,plVar4[1] + *plVar4);
      local_c8._M_string_length = 0;
      local_c8.field_2._M_local_buf[0] = '\0';
      wrapQuotes = Wrap;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      cmGeneratorExpression::Evaluate
                (&result,&local_50,local_78,&local_98,(cmGeneratorTarget *)0x0,
                 (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                 local_c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (result._M_string_length == 0) {
        local_d0 = 0;
        bVar2 = 0;
      }
      else {
        str._M_str = (char *)0x0;
        str._M_len = (size_t)result._M_dataplus._M_p;
        cmOutputConverter::EscapeForCMake_abi_cxx11_
                  (&local_c8,(cmOutputConverter *)result._M_string_length,str,wrapQuotes);
        local_f0 = &local_e0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
          local_e0._8_8_ = local_c8.field_2._8_8_;
        }
        else {
          local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_c8._M_dataplus._M_p;
        }
        local_e0._M_allocated_capacity._1_7_ = local_c8.field_2._M_allocated_capacity._1_7_;
        local_e0._M_local_buf[0] = local_c8.field_2._M_local_buf[0];
        local_e8 = local_c8._M_string_length;
        local_d0 = 1;
        bVar2 = 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
        bVar2 = local_d0;
      }
      if ((bVar2 & 1) != 0) {
        if (bVar1) {
          cVar5.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
              cVar5.Level = cVar5.Level + -1;
            } while (cVar5.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  ",2);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)this,*(char **)&local_a8->field_0x8,
                              (long)local_a8->_vptr_basic_ostream);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        }
        cVar5.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
            cVar5.Level = cVar5.Level + -1;
          } while (cVar5.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"    ",4);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,local_f0->_M_local_buf,local_e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        bVar1 = false;
        bVar2 = local_d0;
      }
      if (((bVar2 & 1) != 0) && (local_d0 = 0, local_f0 != &local_e0)) {
        operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
      }
      plVar4 = plVar4 + 4;
    } while (plVar4 != local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WriteGenexEvaluatorArgument(std::ostream& os,
                                 const cm::string_view& keyword,
                                 const std::vector<std::string>& genexes,
                                 const std::string& config,
                                 cmLocalGenerator* lg,
                                 cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, genexes, indent,
    [config, lg](const std::string& genex) -> cm::optional<std::string> {
      std::string result = cmGeneratorExpression::Evaluate(genex, lg, config);
      if (result.empty()) {
        return cm::nullopt;
      }
      return cmOutputConverter::EscapeForCMake(result);
    });
}